

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_swamp_shrine_map.hpp
# Opt level: O2

void __thiscall
PatchOptimizeSwampShrineMap::inject_code(PatchOptimizeSwampShrineMap *this,ROM *rom,World *world)

{
  uint32_t uVar1;
  uint32_t address;
  uint32_t address_00;
  Map *pMVar2;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  initializer_list<md::DataRegister> __l_01;
  initializer_list<md::AddressRegister> __l_02;
  allocator_type local_10a;
  allocator_type local_109;
  string local_108;
  _Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_e8;
  World *local_d0;
  AddressRegister local_c8;
  DataRegister local_b8;
  Code func;
  
  local_d0 = world;
  uVar1 = inject_func_disable_spikeballs_progessively(rom);
  address = inject_func_handle_buttons(rom);
  address_00 = inject_func_handle_platforms(rom);
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8.super_Register._code = '\0';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  __l._M_len = 1;
  __l._M_array = &local_b8;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_108,__l,
             &local_109);
  local_c8.super_Register._code = '\0';
  local_c8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  __l_00._M_len = 1;
  __l_00._M_array = &local_c8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_e8,__l_00,
             &local_10a);
  md::Code::movem_to_stack
            (&func,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_108,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_e8);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_e8);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base
            ((_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_108);
  md::Code::jsr(&func,uVar1);
  md::Code::jsr(&func,address);
  md::Code::jsr(&func,address_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"ret",(allocator<char> *)&local_e8);
  md::Code::label(&func,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  local_b8.super_Register._code = '\0';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  __l_01._M_len = 1;
  __l_01._M_array = &local_b8;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_108,__l_01,
             &local_109);
  local_c8.super_Register._code = '\0';
  local_c8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  __l_02._M_len = 1;
  __l_02._M_array = &local_c8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_e8,__l_02,
             &local_10a);
  md::Code::movem_from_stack
            (&func,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_108,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_e8);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_e8);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base
            ((_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_108);
  md::Code::rts(&func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"",(allocator<char> *)&local_e8);
  uVar1 = md::ROM::inject_code(rom,&func,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  pMVar2 = World::map(local_d0,0x17);
  pMVar2->_map_update_addr = uVar1;
  md::Code::~Code(&func);
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        uint32_t func_disable_spikeballs_progessively = inject_func_disable_spikeballs_progessively(rom);
        uint32_t func_handle_buttons = inject_func_handle_buttons(rom);
        uint32_t func_handle_platforms = inject_func_handle_platforms(rom);

        md::Code func;
        func.movem_to_stack({ reg_D0 }, { reg_A0 });
        {
            func.jsr(func_disable_spikeballs_progessively);
            func.jsr(func_handle_buttons);
            func.jsr(func_handle_platforms);
        }
        func.label("ret");
        func.movem_from_stack({ reg_D0 }, { reg_A0 });
        func.rts();

        uint32_t update_func_addr = rom.inject_code(func);
        world.map(MAP_SWAMP_SHRINE_23)->map_update_addr(update_func_addr);
    }